

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArmParser.cpp
# Opt level: O3

bool __thiscall
ArmParser::decodeAddressingMode(ArmParser *this,string *text,size_t *pos,uchar *dest)

{
  byte bVar1;
  byte bVar2;
  size_t sVar3;
  pointer pcVar4;
  byte bVar5;
  uchar uVar6;
  
  sVar3 = *pos;
  if (text->_M_string_length < sVar3 + 2) {
    return false;
  }
  pcVar4 = (text->_M_dataplus)._M_p;
  bVar1 = pcVar4[sVar3];
  bVar2 = pcVar4[sVar3 + 1];
  if ((bVar1 ^ 0x69) == 0 && (bVar2 ^ 0x62) == 0) {
    uVar6 = '\0';
  }
  else {
    bVar5 = bVar2 ^ 0x61;
    uVar6 = '\x01';
    if ((bVar1 ^ 0x69) != 0 || bVar5 != 0) {
      uVar6 = '\x02';
      if (((bVar2 ^ 0x62) != 0 || (bVar1 ^ 100) != 0) &&
         (uVar6 = '\x03', (bVar1 ^ 100) != 0 || bVar5 != 0)) {
        uVar6 = '\x04';
        if ((bVar1 ^ 0x65) != 0 || (bVar2 ^ 100) != 0) {
          uVar6 = '\x05';
          if ((((bVar2 ^ 100) != 0 || (bVar1 ^ 0x66) != 0) &&
              (uVar6 = '\x06', (bVar1 ^ 0x65) != 0 || bVar5 != 0)) &&
             (uVar6 = '\a', (bVar1 ^ 0x66) != 0 || bVar5 != 0)) {
            return false;
          }
        }
      }
    }
  }
  *dest = uVar6;
  *pos = *pos + 2;
  return true;
}

Assistant:

bool ArmParser::decodeAddressingMode(const std::string& text, size_t& pos, unsigned char& dest)
{
	if (pos+2 > text.size())
		return false;

	char c1 = text[pos+0];
	char c2 = text[pos+1];

	if      (c1 == 'i' && c2 == 'b') dest = ARM_AMODE_IB;
	else if (c1 == 'i' && c2 == 'a') dest = ARM_AMODE_IA;
	else if (c1 == 'd' && c2 == 'b') dest = ARM_AMODE_DB;
	else if (c1 == 'd' && c2 == 'a') dest = ARM_AMODE_DA;
	else if (c1 == 'e' && c2 == 'd') dest = ARM_AMODE_ED;
	else if (c1 == 'f' && c2 == 'd') dest = ARM_AMODE_FD;
	else if (c1 == 'e' && c2 == 'a') dest = ARM_AMODE_EA;
	else if (c1 == 'f' && c2 == 'a') dest = ARM_AMODE_FA;
	else
		return false;

	pos += 2;
	return true;
}